

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void EnsureStdPipe(int fd)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = fcntl(fd,1);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 9) {
      iVar1 = open("/dev/null",(uint)(fd != 0));
      if (iVar1 == -1) {
        EnsureStdPipe();
        return;
      }
      if (iVar1 != fd) {
        dup2(iVar1,fd);
        close(iVar1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void EnsureStdPipe(int fd)
{
  if (fcntl(fd, F_GETFD) != -1 || errno != EBADF) {
    return;
  }

  int f = open("/dev/null", fd == STDIN_FILENO ? O_RDONLY : O_WRONLY);
  if (f == -1) {
    perror("failed to open /dev/null for missing stdio pipe");
    abort();
  }
  if (f != fd) {
    dup2(f, fd);
    close(f);
  }
}